

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::selectAll(QAbstractItemViewPrivate *this,SelectionFlags command)

{
  QPersistentModelIndex *this_00;
  Data *pDVar1;
  QAbstractItemModel *pQVar2;
  QAbstractItemModel *pQVar3;
  QObject *pQVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  QModelIndex local_e0;
  QModelIndex local_c8;
  QModelIndex local_b0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  Data *local_58;
  QItemSelectionRange *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->selectionModel).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->selectionModel).wp.value != (QObject *)0x0)) {
    pQVar2 = this->model;
    this_00 = &this->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    cVar5 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,(QModelIndex *)&local_58);
    if (cVar5 != '\0') {
      local_58 = (Data *)0x0;
      pQStack_50 = (QItemSelectionRange *)0x0;
      local_48.ptr = (QAbstractItemModel *)0x0;
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = this->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_78,pQVar2,0,0,(QModelIndex *)&local_98);
      local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = this->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_b0,this_00);
      iVar6 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_b0);
      pQVar3 = this->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_c8,this_00);
      iVar7 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_c8);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_e0,this_00);
      (**(code **)(*(long *)pQVar2 + 0x60))
                ((QModelIndex *)&local_98,pQVar2,iVar6 + -1,iVar7 + -1,&local_e0);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_b0,(QModelIndex *)&local_78);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_b0.i,(QModelIndex *)&local_98);
      QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                ((QMovableArrayOps<QItemSelectionRange> *)&local_58,0,
                 (QItemSelectionRange *)&local_b0);
      QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b0.i);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b0);
      pQVar4 = (this->selectionModel).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x70))
                (pQVar4,(QArrayDataPointer<QItemSelectionRange> *)&local_58,
                 command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::selectAll(QItemSelectionModel::SelectionFlags command)
{
    if (!selectionModel)
        return;
    if (!model->hasChildren(root))
        return;

    QItemSelection selection;
    QModelIndex tl = model->index(0, 0, root);
    QModelIndex br = model->index(model->rowCount(root) - 1,
                                  model->columnCount(root) - 1,
                                  root);
    selection.append(QItemSelectionRange(tl, br));
    selectionModel->select(selection, command);
}